

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::reserve
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this,
          size_t capacity)

{
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  ulong uVar2;
  size_t sVar3;
  ulong in_RSI;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_RDI;
  uint i;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *mem;
  size_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar4;
  
  uVar2._0_4_ = (in_RDI->numeral)._num._val[0]._mp_alloc;
  uVar2._4_4_ = (in_RDI->numeral)._num._val[0]._mp_size;
  if (uVar2 < in_RSI) {
    pMVar1 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             Lib::alloc(in_stack_ffffffffffffffd0);
    if ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
        (in_RDI->numeral)._num._val[0]._mp_d ==
        (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) {
      (in_RDI->numeral)._num._val[0]._mp_d = (mp_limb_t *)pMVar1;
      *(Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RDI->numeral)._den._val =
           pMVar1;
      (in_RDI->numeral)._num._val[0]._mp_alloc = (int)in_RSI;
      (in_RDI->numeral)._num._val[0]._mp_size = (int)(in_RSI >> 0x20);
      (in_RDI->numeral)._den._val[0]._mp_d =
           (mp_limb_t *)
           ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
            (in_RDI->numeral)._num._val[0]._mp_d + *(size_t *)(in_RDI->numeral)._num._val);
    }
    else {
      uVar4 = 0;
      while( true ) {
        uVar2 = (ulong)uVar4;
        sVar3 = size((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
                     in_RDI);
        if (sVar3 <= uVar2) break;
        operator[]((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)in_RDI
                   ,(ulong)uVar4);
        Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
                  ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                   CONCAT44(uVar4,in_stack_ffffffffffffffe0),in_RDI);
        uVar4 = uVar4 + 1;
      }
      Lib::free((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                (in_RDI->numeral)._num._val[0]._mp_d);
      *(Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RDI->numeral)._den._val =
           pMVar1 + ((long)*(Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                            (in_RDI->numeral)._den._val - (long)(in_RDI->numeral)._num._val[0]._mp_d
                    ) / 0x30;
      (in_RDI->numeral)._num._val[0]._mp_alloc = (int)in_RSI;
      (in_RDI->numeral)._num._val[0]._mp_size = (int)(in_RSI >> 0x20);
      (in_RDI->numeral)._num._val[0]._mp_d = (mp_limb_t *)pMVar1;
      (in_RDI->numeral)._den._val[0]._mp_d =
           (mp_limb_t *)
           ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
            (in_RDI->numeral)._num._val[0]._mp_d + *(size_t *)(in_RDI->numeral)._num._val);
    }
  }
  return;
}

Assistant:

inline
  void reserve(size_t capacity) 
  {
    if (_capacity >= capacity) {
      return;
    }
    C* mem = static_cast<C*>(ALLOC_KNOWN(capacity*sizeof(C),className()));
    if (_stack) {
      for (unsigned i = 0; i < size(); i++) {
        ::new(&mem[i]) C(std::move((*this)[i]));
      }
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());

      _cursor = mem + (_cursor - _stack);
      _capacity = capacity;
      _stack = mem;
      _end = _stack + _capacity;
    } else {
      _stack = mem;
      _cursor = mem;
      _capacity = capacity;
      _end = _stack + _capacity;
    }
  }